

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O3

parse_dynamic_spec_result<char>
fmt::v11::detail::parse_dynamic_spec<char>
          (char *begin,char *end,int *value,arg_ref<char> *ref,parse_context<char> *ctx)

{
  int iVar1;
  ulong uVar2;
  char *begin_00;
  parse_dynamic_spec_result<char> pVar3;
  arg_id_kind kind;
  arg_id_kind local_34;
  char *local_30;
  dynamic_spec_handler<char> local_28;
  
  local_34 = none;
  local_30 = begin;
  if ((byte)(*begin - 0x30U) < 10) {
    iVar1 = parse_nonnegative_int<char>(&local_30,end,-1);
    if (iVar1 == -1) {
      report_error("number is too big");
    }
    *value = iVar1;
    uVar2 = 0;
LAB_0027de87:
    pVar3._8_8_ = uVar2;
    pVar3.end = local_30;
    return pVar3;
  }
  if (*begin == '{') {
    begin_00 = begin + 1;
    if (begin_00 != end) {
      if ((*begin_00 == '}') || (*begin_00 == ':')) {
        iVar1 = ctx->next_arg_id_;
        if (iVar1 < 0) {
          report_error("cannot switch from manual to automatic argument indexing");
        }
        ctx->next_arg_id_ = iVar1 + 1;
        ref->index = iVar1;
        local_34 = index;
      }
      else {
        local_28.kind = &local_34;
        local_28.ctx = ctx;
        local_28.ref = ref;
        begin_00 = parse_arg_id<char,fmt::v11::detail::dynamic_spec_handler<char>>
                             (begin_00,end,&local_28);
      }
    }
    if ((begin_00 != end) && (*begin_00 == '}')) {
      local_30 = begin_00 + 1;
      uVar2 = (ulong)local_34;
      goto LAB_0027de87;
    }
  }
  report_error("invalid format string");
}

Assistant:

FMT_CONSTEXPR auto parse_dynamic_spec(const Char* begin, const Char* end,
                                      int& value, arg_ref<Char>& ref,
                                      parse_context<Char>& ctx)
    -> parse_dynamic_spec_result<Char> {
  FMT_ASSERT(begin != end, "");
  auto kind = arg_id_kind::none;
  if ('0' <= *begin && *begin <= '9') {
    int val = parse_nonnegative_int(begin, end, -1);
    if (val == -1) report_error("number is too big");
    value = val;
  } else {
    if (*begin == '{') {
      ++begin;
      if (begin != end) {
        Char c = *begin;
        if (c == '}' || c == ':') {
          int id = ctx.next_arg_id();
          ref = id;
          kind = arg_id_kind::index;
          ctx.check_dynamic_spec(id);
        } else {
          begin = parse_arg_id(begin, end,
                               dynamic_spec_handler<Char>{ctx, ref, kind});
        }
      }
      if (begin != end && *begin == '}') return {++begin, kind};
    }
    report_error("invalid format string");
  }
  return {begin, kind};
}